

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O1

void __thiscall perlin::perlin(perlin *this)

{
  int i;
  long lVar1;
  double dVar2;
  double local_30;
  double local_28;
  double local_20;
  
  memset(this,0,0x1800);
  lVar1 = 0x10;
  do {
    vec3::random();
    dVar2 = local_20 * local_20 + local_30 * local_30 + local_28 * local_28;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar2 = 1.0 / dVar2;
    *(double *)((long)this->randvec[0].e + lVar1 + -0x10) = local_30 * dVar2;
    *(double *)((long)this->randvec[0].e + lVar1 + -8) = local_28 * dVar2;
    *(double *)((long)this->randvec[0].e + lVar1) = dVar2 * local_20;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1810);
  lVar1 = 0;
  do {
    this->perm_x[lVar1] = (int)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  permute(this->perm_x,0x100);
  lVar1 = 0;
  do {
    this->perm_y[lVar1] = (int)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  permute(this->perm_y,0x100);
  lVar1 = 0;
  do {
    this->perm_z[lVar1] = (int)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  permute(this->perm_z,0x100);
  return;
}

Assistant:

perlin() {
        for (int i = 0; i < point_count; i++) {
            randvec[i] = unit_vector(vec3::random(-1,1));
        }

        perlin_generate_perm(perm_x);
        perlin_generate_perm(perm_y);
        perlin_generate_perm(perm_z);
    }